

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O1

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)0>::butterfly_radix8<32l>
          (fft<float,2048l,(re::fft::direction)0> *this,span<std::complex<float>,_32L> out)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pfVar4 = (float *)((long)out.storage_.data_ + 0xec);
  lVar1 = 0x200;
  lVar2 = 0x300;
  lVar3 = 0x280;
  lVar5 = 0x380;
  do {
    fVar6 = (float)*(undefined8 *)(this + lVar1 * 4);
    fVar7 = (float)((ulong)*(undefined8 *)(this + lVar1 * 4) >> 0x20);
    fVar8 = (float)*(undefined8 *)(pfVar4 + -0x31);
    fVar9 = (float)((ulong)*(undefined8 *)(pfVar4 + -0x31) >> 0x20);
    *(ulong *)(pfVar4 + -0x31) =
         CONCAT44(fVar7 * fVar8 + fVar9 * fVar6,fVar8 * fVar6 - fVar7 * fVar9);
    fVar8 = (float)*(undefined8 *)(this + lVar1 * 2);
    fVar9 = (float)((ulong)*(undefined8 *)(this + lVar1 * 2) >> 0x20);
    fVar6 = (float)*(undefined8 *)(pfVar4 + -0x29);
    fVar7 = (float)((ulong)*(undefined8 *)(pfVar4 + -0x29) >> 0x20);
    fVar14 = fVar6 * fVar8 - fVar9 * fVar7;
    fVar12 = fVar9 * fVar6 + fVar7 * fVar8;
    *(ulong *)(pfVar4 + -0x29) = CONCAT44(fVar12,fVar14);
    fVar8 = (float)*(undefined8 *)(this + lVar2 * 4);
    fVar9 = (float)((ulong)*(undefined8 *)(this + lVar2 * 4) >> 0x20);
    fVar6 = (float)*(undefined8 *)(pfVar4 + -0x21);
    fVar7 = (float)((ulong)*(undefined8 *)(pfVar4 + -0x21) >> 0x20);
    *(ulong *)(pfVar4 + -0x21) =
         CONCAT44(fVar9 * fVar6 + fVar7 * fVar8,fVar6 * fVar8 - fVar9 * fVar7);
    fVar8 = (float)*(undefined8 *)(this + lVar1);
    fVar9 = (float)((ulong)*(undefined8 *)(this + lVar1) >> 0x20);
    fVar6 = (float)*(undefined8 *)(pfVar4 + -0x19);
    fVar7 = (float)((ulong)*(undefined8 *)(pfVar4 + -0x19) >> 0x20);
    fVar17 = fVar6 * fVar8 - fVar9 * fVar7;
    fVar16 = fVar9 * fVar6 + fVar7 * fVar8;
    *(ulong *)(pfVar4 + -0x19) = CONCAT44(fVar16,fVar17);
    fVar8 = (float)*(undefined8 *)(this + lVar3 * 4);
    fVar9 = (float)((ulong)*(undefined8 *)(this + lVar3 * 4) >> 0x20);
    fVar6 = (float)*(undefined8 *)(pfVar4 + -0x11);
    fVar7 = (float)((ulong)*(undefined8 *)(pfVar4 + -0x11) >> 0x20);
    *(ulong *)(pfVar4 + -0x11) =
         CONCAT44(fVar9 * fVar6 + fVar7 * fVar8,fVar6 * fVar8 - fVar9 * fVar7);
    fVar8 = (float)*(undefined8 *)(this + lVar2 * 2);
    fVar9 = (float)((ulong)*(undefined8 *)(this + lVar2 * 2) >> 0x20);
    fVar6 = (float)*(undefined8 *)(pfVar4 + -9);
    fVar7 = (float)((ulong)*(undefined8 *)(pfVar4 + -9) >> 0x20);
    fVar18 = fVar6 * fVar8 - fVar9 * fVar7;
    fVar6 = fVar9 * fVar6 + fVar7 * fVar8;
    *(ulong *)(pfVar4 + -9) = CONCAT44(fVar6,fVar18);
    fVar7 = (float)*(undefined8 *)(this + lVar5 * 4);
    fVar8 = (float)((ulong)*(undefined8 *)(this + lVar5 * 4) >> 0x20);
    fVar9 = (float)*(undefined8 *)(pfVar4 + -1);
    fVar10 = (float)((ulong)*(undefined8 *)(pfVar4 + -1) >> 0x20);
    *(ulong *)(pfVar4 + -1) =
         CONCAT44(fVar8 * fVar9 + fVar10 * fVar7,fVar9 * fVar7 - fVar8 * fVar10);
    fVar8 = (float)*(undefined8 *)(pfVar4 + -0x39);
    fVar9 = (float)((ulong)*(undefined8 *)(pfVar4 + -0x39) >> 0x20);
    fVar10 = pfVar4[-0x31] + fVar8;
    fVar11 = fVar9 + pfVar4[-0x30];
    fVar8 = fVar8 - pfVar4[-0x31];
    fVar9 = fVar9 - pfVar4[-0x30];
    *(ulong *)(pfVar4 + -0x39) = CONCAT44(fVar11,fVar10);
    *(ulong *)(pfVar4 + -0x31) = CONCAT44(fVar9,fVar8);
    fVar15 = fVar14 - pfVar4[-0x21];
    fVar13 = fVar12 - pfVar4[-0x20];
    *(ulong *)(pfVar4 + -0x29) = CONCAT44(fVar12 + pfVar4[-0x20],fVar14 + pfVar4[-0x21]);
    *(ulong *)(pfVar4 + -0x21) = CONCAT44(fVar13,fVar15);
    fVar21 = fVar17 + pfVar4[-0x11];
    fVar20 = fVar16 + pfVar4[-0x10];
    fVar17 = fVar17 - pfVar4[-0x11];
    fVar16 = fVar16 - pfVar4[-0x10];
    *(ulong *)(pfVar4 + -0x19) = CONCAT44(fVar20,fVar21);
    *(ulong *)(pfVar4 + -0x11) = CONCAT44(fVar16,fVar17);
    fVar19 = fVar18 - pfVar4[-1];
    fVar7 = fVar6 - *pfVar4;
    *(ulong *)(pfVar4 + -9) = CONCAT44(fVar6 + *pfVar4,fVar18 + pfVar4[-1]);
    *(ulong *)(pfVar4 + -1) = CONCAT44(fVar7,fVar19);
    *(ulong *)(pfVar4 + -0x21) = CONCAT44(fVar15,fVar13) ^ 0x8000000000000000;
    fVar6 = (float)*(undefined8 *)(this + 0x20);
    fVar12 = (float)((ulong)*(undefined8 *)(this + 0x20) >> 0x20);
    fVar14 = fVar17 * fVar6 - fVar12 * fVar16;
    fVar6 = fVar12 * fVar17 + fVar16 * fVar6;
    *(ulong *)(pfVar4 + -0x11) = CONCAT44(fVar6,fVar14);
    fVar12 = (float)*(undefined8 *)(this + 0x20);
    fVar13 = (float)((ulong)*(undefined8 *)(this + 0x20) >> 0x20);
    *(ulong *)(pfVar4 + -1) =
         CONCAT44(fVar19 * fVar12 - fVar13 * fVar7,fVar13 * fVar19 + fVar7 * fVar12) ^
         0x8000000000000000;
    fVar12 = fVar10 + pfVar4[-0x29];
    fVar16 = fVar11 + pfVar4[-0x28];
    fVar10 = fVar10 - pfVar4[-0x29];
    fVar11 = fVar11 - pfVar4[-0x28];
    *(ulong *)(pfVar4 + -0x39) = CONCAT44(fVar16,fVar12);
    *(ulong *)(pfVar4 + -0x29) = CONCAT44(fVar11,fVar10);
    fVar13 = fVar8 + pfVar4[-0x21];
    fVar17 = fVar9 + pfVar4[-0x20];
    fVar8 = fVar8 - pfVar4[-0x21];
    fVar9 = fVar9 - pfVar4[-0x20];
    *(ulong *)(pfVar4 + -0x31) = CONCAT44(fVar17,fVar13);
    *(ulong *)(pfVar4 + -0x21) = CONCAT44(fVar9,fVar8);
    fVar19 = fVar21 - pfVar4[-9];
    fVar18 = fVar20 - pfVar4[-8];
    *(ulong *)(pfVar4 + -0x19) = CONCAT44(fVar20 + pfVar4[-8],fVar21 + pfVar4[-9]);
    *(ulong *)(pfVar4 + -9) = CONCAT44(fVar18,fVar19);
    fVar15 = fVar14 - pfVar4[-1];
    fVar7 = fVar6 - *pfVar4;
    *(ulong *)(pfVar4 + -0x11) = CONCAT44(fVar6 + *pfVar4,fVar14 + pfVar4[-1]);
    *(ulong *)(pfVar4 + -1) = CONCAT44(fVar7,fVar15);
    *(ulong *)(pfVar4 + -9) = CONCAT44(fVar19,fVar18) ^ 0x8000000000000000;
    *(ulong *)(pfVar4 + -1) = CONCAT44(fVar15,fVar7) ^ 0x8000000000000000;
    *(ulong *)(pfVar4 + -0x39) = CONCAT44(fVar16 + pfVar4[-0x18],fVar12 + pfVar4[-0x19]);
    *(ulong *)(pfVar4 + -0x19) = CONCAT44(fVar16 - pfVar4[-0x18],fVar12 - pfVar4[-0x19]);
    *(ulong *)(pfVar4 + -0x31) = CONCAT44(fVar17 + pfVar4[-0x10],fVar13 + pfVar4[-0x11]);
    *(ulong *)(pfVar4 + -0x11) = CONCAT44(fVar17 - pfVar4[-0x10],fVar13 - pfVar4[-0x11]);
    *(ulong *)(pfVar4 + -0x29) = CONCAT44(fVar11 + pfVar4[-8],fVar10 + pfVar4[-9]);
    *(ulong *)(pfVar4 + -9) = CONCAT44(fVar11 - pfVar4[-8],fVar10 - pfVar4[-9]);
    *(ulong *)(pfVar4 + -0x21) = CONCAT44(fVar9 + *pfVar4,fVar8 + pfVar4[-1]);
    *(ulong *)(pfVar4 + -1) = CONCAT44(fVar9 - *pfVar4,fVar8 - pfVar4[-1]);
    lVar1 = lVar1 + 0x200;
    pfVar4 = pfVar4 + 2;
    lVar2 = lVar2 + 0x300;
    lVar3 = lVar3 + 0x280;
    lVar5 = lVar5 + 0x380;
  } while (lVar1 != 0x800);
  return;
}

Assistant:

inline void
    butterfly_radix8(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 1; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[4*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[2*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[6*i*s]);
                out[i + 4*m] = multiply_fast(out[i + 4*m], twiddles[1*i*s]);
                out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[5*i*s]);
                out[i + 6*m] = multiply_fast(out[i + 6*m], twiddles[3*i*s]);
                out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[7*i*s]);
            }

            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 5*m]);
            scissors(out[i + 6*m], out[i + 7*m]);

            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[m]);
            out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 2*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 6*m]);
            scissors(out[i + 5*m], out[i + 7*m]);

            out[i + 6*m] = flip<Direction>(out[i + 6*m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 4*m]);
            scissors(out[i + 1*m], out[i + 5*m]);
            scissors(out[i + 2*m], out[i + 6*m]);
            scissors(out[i + 3*m], out[i + 7*m]);
        }
    }